

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

bool P_CheckSight(AActor *t1,AActor *t2,int flags)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  sector_t *psVar7;
  sector_t *this;
  bool bVar8;
  bool bVar9;
  sector_t_conflict *psVar10;
  uint uVar11;
  ulong uVar12;
  FRandom *this_00;
  long lVar13;
  double dVar14;
  sector_t_conflict *sec;
  timespec ts;
  SightTask task;
  sector_t *local_f0;
  SightCheck local_e8;
  undefined8 local_50;
  double local_48;
  double local_40;
  undefined4 local_38;
  int local_34;
  
  clock_gettime(1,(timespec *)&local_e8);
  SightCycles.Sec =
       SightCycles.Sec -
       ((double)(long)local_e8.sightstart.Y * 1e-09 + (double)(long)local_e8.sightstart.X);
  if (t1 == (AActor *)0x0) {
    __assert_fail("t1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x32f,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  if (t2 == (AActor *)0x0) {
    __assert_fail("t2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x330,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  psVar7 = t1->Sector;
  this = t2->Sector;
  if ((rejectmatrix != (BYTE *)0x0) &&
     (uVar11 = (int)((ulong)((long)this - (long)sectors) >> 3) * 0x7a44c6b +
               (int)((ulong)((long)psVar7 - (long)sectors) >> 3) * numsectors * 0x7a44c6b,
     (rejectmatrix[(int)uVar11 >> 3] >> (uVar11 & 7) & 1) != 0)) {
    sightcounts[0] = sightcounts[0] + 1;
    goto LAB_00451765;
  }
  if (((flags & 1U) == 0) &&
     ((((t2->renderflags).Value & 0x8000) != 0 ||
      (bVar8 = FRenderStyle::IsVisible((FRenderStyle *)&(t2->RenderStyle).field_0,t2->Alpha), !bVar8
      )))) {
    this_00 = &pr_checksight;
    if (bglobal.m_Thinking != false) {
      this_00 = &pr_botchecksight;
    }
    uVar11 = FRandom::GenRand32(this_00);
    if (0x32 < (uVar11 & 0xff)) goto LAB_00451765;
  }
  if ((flags & 8U) == 0) {
    psVar10 = sector_t::GetHeightSec(psVar7);
    if (psVar10 == (sector_t_conflict *)0x0) {
LAB_00451507:
      psVar10 = sector_t::GetHeightSec(this);
      if (psVar10 == (sector_t_conflict *)0x0) goto LAB_00451619;
      dVar14 = (t2->__Pos).Z;
      psVar7 = this->heightsec;
      dVar1 = (psVar7->floorplane).D;
      dVar2 = (psVar7->floorplane).normal.X;
      dVar3 = (psVar7->floorplane).normal.Y;
      dVar4 = (t2->__Pos).X;
      dVar5 = (t2->__Pos).Y;
      dVar6 = (psVar7->floorplane).negiC;
      if (((dVar3 * dVar5 + dVar2 * dVar4 + dVar1) * dVar6 < t2->Height + dVar14) ||
         ((t1->__Pos).Z < dVar6 * (dVar3 * (t1->__Pos).Y + dVar1 + dVar2 * (t1->__Pos).X))) {
        dVar1 = (psVar7->ceilingplane).D;
        dVar2 = (psVar7->ceilingplane).normal.X;
        dVar3 = (psVar7->ceilingplane).normal.Y;
        dVar6 = (psVar7->ceilingplane).negiC;
        if ((dVar14 < (dVar5 * dVar3 + dVar4 * dVar2 + dVar1) * dVar6) ||
           (dVar6 * (dVar3 * (t1->__Pos).Y + dVar1 + dVar2 * (t1->__Pos).X) <
            (t1->__Pos).Z + t1->Height)) goto LAB_00451619;
      }
    }
    else {
      dVar14 = (t1->__Pos).Z;
      psVar7 = psVar7->heightsec;
      dVar1 = (psVar7->floorplane).D;
      dVar2 = (psVar7->floorplane).normal.X;
      dVar3 = (psVar7->floorplane).normal.Y;
      dVar4 = (t1->__Pos).X;
      dVar5 = (t1->__Pos).Y;
      dVar6 = (psVar7->floorplane).negiC;
      if (((dVar3 * dVar5 + dVar2 * dVar4 + dVar1) * dVar6 < t1->Height + dVar14) ||
         ((t2->__Pos).Z < dVar6 * (dVar3 * (t2->__Pos).Y + dVar1 + dVar2 * (t2->__Pos).X))) {
        dVar1 = (psVar7->ceilingplane).D;
        dVar2 = (psVar7->ceilingplane).normal.X;
        dVar3 = (psVar7->ceilingplane).normal.Y;
        dVar6 = (psVar7->ceilingplane).negiC;
        if ((dVar14 < (dVar5 * dVar3 + dVar4 * dVar2 + dVar1) * dVar6) ||
           (dVar6 * (dVar3 * (t2->__Pos).Y + dVar1 + dVar2 * (t2->__Pos).X) <
            (t2->__Pos).Z + t2->Height)) goto LAB_00451507;
      }
    }
LAB_00451765:
    bVar8 = false;
  }
  else {
LAB_00451619:
    validcount = validcount + 1;
    if (portals.Count != 0) {
      portals.Count = 0;
    }
    dVar14 = t1->Height * 0.75 + (t1->__Pos).Z;
    AActor::GetPortalTransition(&local_e8.sightstart,t1,dVar14,&local_f0);
    local_40 = (t2->__Pos).Z - dVar14;
    local_48 = t2->Height + local_40;
    local_50 = 0;
    local_38 = 0xffffffff;
    local_34 = local_f0->PortalGroup;
    SightCheck::init(&local_e8,(EVP_PKEY_CTX *)t1);
    bVar8 = SightCheck::P_SightPathTraverse(&local_e8);
    if ((!bVar8) && (dVar14 = AActor::Distance2D(t1,t2,false), portals.Count != 0)) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        *(double *)((long)&(portals.Array)->Frac + lVar13) =
             *(double *)((long)&(portals.Array)->Frac + lVar13) + 1.0 / dVar14;
        SightCheck::init(&local_e8,(EVP_PKEY_CTX *)t1);
        bVar9 = SightCheck::P_SightPathTraverse(&local_e8);
        if (bVar9) {
          bVar8 = true;
          break;
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar12 < portals.Count);
    }
  }
  clock_gettime(1,(timespec *)&local_e8);
  SightCycles.Sec =
       (double)(long)local_e8.sightstart.Y * 1e-09 + (double)(long)local_e8.sightstart.X +
       SightCycles.Sec;
  return bVar8;
}

Assistant:

bool P_CheckSight (AActor *t1, AActor *t2, int flags)
{
	SightCycles.Clock();

	bool res;

	assert (t1 != NULL);
	assert (t2 != NULL);
	if (t1 == NULL || t2 == NULL)
	{
		return false;
	}

	const sector_t *s1 = t1->Sector;
	const sector_t *s2 = t2->Sector;
	int pnum = int(s1 - sectors) * numsectors + int(s2 - sectors);

//
// check for trivial rejection
//
	if (rejectmatrix != NULL &&
		(rejectmatrix[pnum>>3] & (1 << (pnum & 7))))
	{
sightcounts[0]++;
		res = false;			// can't possibly be connected
		goto done;
	}

//
// check precisely
//
	// [RH] Andy Baker's stealth monsters:
	// Cannot see an invisible object
	if ((flags & SF_IGNOREVISIBILITY) == 0 && ((t2->renderflags & RF_INVISIBLE) || !t2->RenderStyle.IsVisible(t2->Alpha)))
	{ // small chance of an attack being made anyway
		if ((bglobal.m_Thinking ? pr_botchecksight() : pr_checksight()) > 50)
		{
			res = false;
			goto done;
		}
	}

	// killough 4/19/98: make fake floors and ceilings block monster view

	if (!(flags & SF_IGNOREWATERBOUNDARY))
	{
		if ((s1->GetHeightSec() &&
			((t1->Top() <= s1->heightsec->floorplane.ZatPoint(t1) &&
			  t2->Z() >= s1->heightsec->floorplane.ZatPoint(t2)) ||
			 (t1->Z() >= s1->heightsec->ceilingplane.ZatPoint(t1) &&
			  t2->Top() <= s1->heightsec->ceilingplane.ZatPoint(t2))))
			||
			(s2->GetHeightSec() &&
			 ((t2->Top() <= s2->heightsec->floorplane.ZatPoint(t2) &&
			   t1->Z() >= s2->heightsec->floorplane.ZatPoint(t1)) ||
			  (t2->Z() >= s2->heightsec->ceilingplane.ZatPoint(t2) &&
			   t1->Top() <= s2->heightsec->ceilingplane.ZatPoint(t1)))))
		{
			res = false;
			goto done;
		}
	}

	// An unobstructed LOS is possible.
	// Now look from eyes of t1 to any part of t2.

	validcount++;
	portals.Clear();
	{
		sector_t *sec;
		double lookheight = t1->Z() + t1->Height*0.75;
		t1->GetPortalTransition(lookheight, &sec);

		double bottomslope = t2->Z() - lookheight;
		double topslope = bottomslope + t2->Height;
		SightTask task = { 0, topslope, bottomslope, -1, sec->PortalGroup };


		SightCheck s;
		s.init(t1, t2, sec, &task, flags);
		res = s.P_SightPathTraverse ();
		if (!res)
		{
			double dist = t1->Distance2D(t2);
			for (unsigned i = 0; i < portals.Size(); i++)
			{
				portals[i].Frac += 1 / dist;
				s.init(t1, t2, NULL, &portals[i], flags);
				if (s.P_SightPathTraverse())
				{
					res = true;
					break;
				}
			}
		}
	}

done:
	SightCycles.Unclock();
	return res;
}